

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::BeginMainMenuBar(void)

{
  float _x;
  float _y;
  ImVec2 local_34;
  byte local_29;
  float local_28;
  ImGuiWindowFlags IStack_24;
  bool is_open;
  float height;
  ImGuiWindowFlags window_flags;
  ImGuiViewport *local_18;
  ImGuiViewportP *viewport;
  ImGuiContext *g;
  
  viewport = (ImGuiViewportP *)GImGui;
  local_18 = GetMainViewport();
  _x = viewport[0x20].super_ImGuiViewport.Size.x;
  _y = ImMax<float>(viewport[0x20].super_ImGuiViewport.Size.y -
                    (float)viewport[0x1f].DrawDataP.TotalVtxCount,0.0);
  ImVec2::ImVec2((ImVec2 *)&height,_x,_y);
  *(ImVec2 *)((long)viewport[0x2a].DrawLists + 4) = _height;
  IStack_24 = 0x508;
  local_28 = GetFrameHeight();
  local_29 = BeginViewportSideBar("##MainMenuBar",local_18,2,local_28,IStack_24);
  ImVec2::ImVec2(&local_34,0.0,0.0);
  *(ImVec2 *)((long)viewport[0x2a].DrawLists + 4) = local_34;
  if ((local_29 & 1) == 0) {
    End();
  }
  else {
    BeginMenuBar();
  }
  return (bool)(local_29 & 1);
}

Assistant:

bool ImGui::BeginMainMenuBar()
{
    ImGuiContext& g = *GImGui;
    ImGuiViewportP* viewport = (ImGuiViewportP*)(void*)GetMainViewport();

    // For the main menu bar, which cannot be moved, we honor g.Style.DisplaySafeAreaPadding to ensure text can be visible on a TV set.
    // FIXME: This could be generalized as an opt-in way to clamp window->DC.CursorStartPos to avoid SafeArea?
    // FIXME: Consider removing support for safe area down the line... it's messy. Nowadays consoles have support for TV calibration in OS settings.
    g.NextWindowData.MenuBarOffsetMinVal = ImVec2(g.Style.DisplaySafeAreaPadding.x, ImMax(g.Style.DisplaySafeAreaPadding.y - g.Style.FramePadding.y, 0.0f));
    ImGuiWindowFlags window_flags = ImGuiWindowFlags_NoScrollbar | ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_MenuBar;
    float height = GetFrameHeight();
    bool is_open = BeginViewportSideBar("##MainMenuBar", viewport, ImGuiDir_Up, height, window_flags);
    g.NextWindowData.MenuBarOffsetMinVal = ImVec2(0.0f, 0.0f);

    if (is_open)
        BeginMenuBar();
    else
        End();
    return is_open;
}